

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_node::append_buffer
          (xml_parse_result *__return_storage_ptr__,xml_node *this,void *contents,size_t size,
          uint options,xml_encoding encoding)

{
  xml_allocator *this_00;
  char_t *pcVar1;
  char_t **out_buffer;
  ulong uVar2;
  xml_node_struct *pxVar3;
  xml_node local_48;
  size_t local_40;
  ulong local_38;
  
  pxVar3 = this->_root;
  if ((pxVar3 == (xml_node_struct *)0x0) || (((uint)pxVar3->header & 0xf) - 3 < 0xfffffffe)) {
LAB_006f41ce:
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_append_invalid_root;
LAB_006f41dc:
    __return_storage_ptr__->offset = 0;
  }
  else {
    if ((options >> 0xe & 1) != 0) {
      if (pxVar3->first_child == (xml_node_struct *)0x0) {
        xml_node(&local_48);
      }
      else {
        xml_node(&local_48,pxVar3->first_child->prev_sibling_c);
      }
      if ((local_48._root != (xml_node_struct *)0x0) && (((local_48._root)->header & 0xf) == 3))
      goto LAB_006f41ce;
    }
    pxVar3 = this->_root;
    this_00 = *(xml_allocator **)((long)pxVar3 - (pxVar3->header >> 8));
    this_00[-4]._root = (xml_memory_page *)((ulong)this_00[-4]._root | 0x40);
    uVar2 = this_00->_busy_size + 0x18;
    if (uVar2 < 0x7fd9) {
      out_buffer = (char_t **)((long)&this_00->_root[1].allocator + this_00->_busy_size);
      this_00->_busy_size = uVar2;
      uVar2 = (ulong)encoding;
    }
    else {
      local_40 = size;
      local_38 = (ulong)encoding;
      out_buffer = (char_t **)
                   impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                             (this_00,0x18,(xml_memory_page **)&local_48);
      if (out_buffer == (char_t **)0x0) {
        xml_parse_result::xml_parse_result(__return_storage_ptr__);
        __return_storage_ptr__->status = status_out_of_memory;
        goto LAB_006f41dc;
      }
      pxVar3 = this->_root;
      size = local_40;
      uVar2 = local_38;
    }
    *out_buffer = (char_t *)0x0;
    out_buffer[1] = (char_t *)this_00[1]._busy_size;
    this_00[1]._busy_size = (size_t)out_buffer;
    pcVar1 = pxVar3->name;
    pxVar3->name = (char_t *)0x0;
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,(xml_document_struct *)(this_00 + -4),pxVar3,contents,size,
               options,(xml_encoding)uVar2,false,false,out_buffer);
    pxVar3->name = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_node::append_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		// append_buffer is only valid for elements/documents
		if (!impl::allow_insert_child(type(), node_element)) return impl::make_parse_result(status_append_invalid_root);

		// append buffer can not merge PCDATA into existing PCDATA nodes
		if ((options & parse_merge_pcdata) != 0 && last_child().type() == node_pcdata) return impl::make_parse_result(status_append_invalid_root);

		// get document node
		impl::xml_document_struct* doc = &impl::get_document(_root);

		// disable document_buffer_order optimization since in a document with multiple buffers comparing buffer pointers does not make sense
		doc->header |= impl::xml_memory_page_contents_shared_mask;

		// get extra buffer element (we'll store the document fragment buffer there so that we can deallocate it later)
		impl::xml_memory_page* page = NULL;
		impl::xml_extra_buffer* extra = static_cast<impl::xml_extra_buffer*>(doc->allocate_memory(sizeof(impl::xml_extra_buffer) + sizeof(void*), page));
		(void)page;

		if (!extra) return impl::make_parse_result(status_out_of_memory);

	#ifdef PUGIXML_COMPACT
		// align the memory block to a pointer boundary; this is required for compact mode where memory allocations are only 4b aligned
		// note that this requires up to sizeof(void*)-1 additional memory, which the allocation above takes into account
		extra = reinterpret_cast<impl::xml_extra_buffer*>((reinterpret_cast<uintptr_t>(extra) + (sizeof(void*) - 1)) & ~(sizeof(void*) - 1));
	#endif

		// add extra buffer to the list
		extra->buffer = NULL;
		extra->next = doc->extra_buffers;
		doc->extra_buffers = extra;

		// name of the root has to be NULL before parsing - otherwise closing node mismatches will not be detected at the top level
		impl::name_null_sentry sentry(_root);

		return impl::load_buffer_impl(doc, _root, const_cast<void*>(contents), size, options, encoding, false, false, &extra->buffer);
	}